

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu_x86.c
# Opt level: O0

SHEMU_STATUS ShemuX86SetOperandValue(SHEMU_CONTEXT *Context,ND_UINT32 Operand,SHEMU_VALUE *Value)

{
  ND_BOOL NVar1;
  SHEMU_STATUS SVar2;
  PND_OPERAND Operand_00;
  ND_UINT64 NVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  ND_UINT64 local_110;
  uint local_104;
  uint local_ec;
  uint local_cc;
  ND_UINT64 local_b8;
  ND_UINT8 *local_a8;
  uint local_8c;
  uint local_7c;
  ND_UINT64 regval_1;
  ND_UINT64 regval;
  ND_UINT64 gla;
  ND_UINT32 stckstrlen;
  ND_UINT32 i;
  ND_UINT64 sptr;
  PND_OPERAND op;
  SHEMU_STATUS status;
  SHEMU_VALUE *Value_local;
  ND_UINT32 Operand_local;
  SHEMU_CONTEXT *Context_local;
  long lStack_10;
  uchar c;
  
  lStack_10 = *(long *)(in_FS_OFFSET + 0x28);
  Operand_00 = (PND_OPERAND)((long)&Context->Arch + (ulong)Operand * 0x20 + 0x40);
  NVar1 = ShemuIsStackPtr(Context,(Value->Value).Qwords[0],(ulong)Context->StrThreshold);
  if (NVar1 != '\0') {
    NVar3 = (Value->Value).Qwords[0];
    gla._0_4_ = 0;
    gla._4_4_ = 0;
    while (((gla._4_4_ < Context->StrThreshold &&
            (SVar2 = ShemuMemLoad(Context,NVar3 + gla._4_4_,1,(ND_UINT8 *)((long)&Context_local + 7)
                                 ), SVar2 == 0)) &&
           ((((0x60 < Context_local._7_1_ && (Context_local._7_1_ < 0x7b)) ||
             (((0x40 < Context_local._7_1_ && (Context_local._7_1_ < 0x5b)) ||
              ((0x2f < Context_local._7_1_ && (Context_local._7_1_ < 0x3a)))))) ||
            ((((Context_local._7_1_ == 0x5c || (Context_local._7_1_ == 0x2f)) ||
              (Context_local._7_1_ == 0x3a)) || (Context_local._7_1_ == 0x20))))))) {
      gla._0_4_ = (uint)gla + 1;
      gla._4_4_ = gla._4_4_ + 1;
    }
    if (Context->StrThreshold <= (uint)gla) {
      Context->Flags = Context->Flags | 0x20;
    }
  }
  if ((undefined1  [32])((undefined1  [32])*Operand_00 & (undefined1  [32])0xf) ==
      (undefined1  [32])0x1) {
    switch((Operand_00->Info).Register.Type) {
    case ND_REG_GPR:
      if ((((*(int *)((long)&Context->Arch + 0x1a8) == 0x6c4) &&
           ((Operand_00->Info).Register.Reg == 4)) &&
          (NVar1 = ShemuX86IsAddressAligned(Context,(Value->Value).Qwords[0]), NVar1 != '\0')) &&
         ((NVar1 = ShemuIsShellcodePtr(Context,(Value->Value).Qwords[0],0x40), NVar1 != '\0' ||
          (NVar1 = ShemuIsStackPtr(Context,(Value->Value).Qwords[0],0x40), NVar1 != '\0')))) {
        Context->Flags = Context->Flags | 0x100;
      }
      ShemuX86SetGprValue(Context,(Operand_00->Info).Register.Reg,Operand_00->Size,
                          (Value->Value).Qwords[0],*(byte *)((long)&Operand_00->Info + 0xd) & 1);
      break;
    case ND_REG_SEG:
      NVar1 = ShemuX86IsSelectorValid
                        (Context,(Operand_00->Info).Register.Reg,(Value->Value).Words[0]);
      if (NVar1 == '\0') {
        Context_local._0_4_ = 0xb;
        goto LAB_00172267;
      }
      ShemuX86SetSegValue(Context,(Operand_00->Info).Register.Reg,(Value->Value).Words[0]);
      break;
    default:
      Context_local._0_4_ = 6;
      goto LAB_00172267;
    case ND_REG_MMX:
      *(ND_UINT64 *)((long)&Context->Arch + (ulong)(Operand_00->Info).Register.Reg * 8 + 0x410) =
           (Value->Value).Qwords[0];
      if ((Context->Options & 1) != 0) {
        shemu_internal_printf
                  (Context,"        MM%d = 0x%016llx\n",(ulong)(Operand_00->Info).Register.Reg,
                   (Value->Value).Qwords[0]);
      }
      break;
    case ND_REG_SSE:
      if ((*(uint *)&Context->Arch >> 0x10 & 0xf) == 0) {
        nd_memset((void *)((long)&Context->Arch +
                          (ulong)(Operand_00->Info).Register.Reg * 0x40 + 0x450),0,0x10);
      }
      else {
        nd_memset((void *)((long)&Context->Arch +
                          (ulong)(Operand_00->Info).Register.Reg * 0x40 + 0x450),0,0x40);
      }
      shemu_memcpy((void *)((long)&Context->Arch +
                           (ulong)(Operand_00->Info).Register.Reg * 0x40 + 0x450),Value,
                   (ulong)Operand_00->Size);
      if ((Context->Options & 1) != 0) {
        if (Operand_00->Size == 0x10) {
          local_7c = 0x58;
        }
        else {
          local_7c = 0x5a;
          if (Operand_00->Size == 0x20) {
            local_7c = 0x59;
          }
        }
        shemu_internal_printf
                  (Context,"        %cMM%d (HI_32) = 0x%016llx%016llx%016llx%016llx\n",
                   (ulong)local_7c,(ulong)(Operand_00->Info).Register.Reg,(Value->Value).Qwords[7],
                   (Value->Value).Qwords[6],(Value->Value).Qwords[5],(Value->Value).Qwords[4]);
        if (Operand_00->Size == 0x10) {
          local_8c = 0x58;
        }
        else {
          local_8c = 0x5a;
          if (Operand_00->Size == 0x20) {
            local_8c = 0x59;
          }
        }
        shemu_internal_printf
                  (Context,"        %cMM%d (LO_32) = 0x%016llx%016llx%016llx%016llx\n",
                   (ulong)local_8c,(ulong)(Operand_00->Info).Register.Reg,(Value->Value).Qwords[3],
                   (Value->Value).Qwords[2],(Value->Value).Qwords[1],(Value->Value).Qwords[0]);
      }
      break;
    case ND_REG_CR:
      switch((Operand_00->Info).Register.Reg) {
      case 0:
        (Context->Arch).X86.Registers.RegCr0 = (Value->Value).Qwords[0];
        break;
      default:
        Context_local._0_4_ = 6;
        goto LAB_00172267;
      case 2:
        (Context->Arch).X86.Registers.RegCr2 = (Value->Value).Qwords[0];
        break;
      case 3:
        (Context->Arch).X86.Registers.RegCr3 = (Value->Value).Qwords[0];
        break;
      case 4:
        (Context->Arch).X86.Registers.RegCr4 = (Value->Value).Qwords[0];
        break;
      case 8:
        (Context->Arch).X86.Registers.RegCr8 = (Value->Value).Qwords[0];
      }
      break;
    case ND_REG_FLG:
      if (Operand_00->Size == 2) {
        *(ND_UINT16 *)((long)&Context->Arch + 0x2f0) = (Value->Value).Words[0];
      }
      else {
        (Context->Arch).X86.Registers.RegFlags = (Value->Value).Qwords[0];
      }
      (Context->Arch).X86.Registers.RegFlags = (Context->Arch).X86.Registers.RegFlags | 2;
      (Context->Arch).X86.Registers.RegFlags =
           (Context->Arch).X86.Registers.RegFlags & 0xffffffffffff7fd7;
      (Context->Arch).X86.Registers.RegFlags = (Context->Arch).X86.Registers.RegFlags & 0x3fffff;
      break;
    case ND_REG_RIP:
      (Context->Arch).X86.Registers.RegRip =
           (Value->Value).Qwords[0] &
           0xffffffffffffffffU >> (('\b' - (char)Value->Size) * '\b' & 0x3fU);
    }
  }
  else {
    if ((undefined1  [32])((undefined1  [32])*Operand_00 & (undefined1  [32])0xf) !=
        (undefined1  [32])0x2) {
      Context_local._0_4_ = 4;
      goto LAB_00172267;
    }
    NVar3 = ShemuX86ComputeLinearAddress(Context,Operand_00);
    NVar1 = ShemuIsShellcodePtr(Context,NVar3,(ulong)Operand_00->Size);
    if (NVar1 != '\0') {
      if ((Context->Options & 0x20) == 0) {
        local_a8 = Context->Intbuf + Context->StackSize;
      }
      else {
        local_a8 = (ND_UINT8 *)0x0;
      }
      if ((Context->Options & 0x20) == 0) {
        local_b8 = Context->ShellcodeSize;
      }
      else {
        local_b8 = 0;
      }
      ShemuBmpStateUpdate(local_a8,local_b8,NVar3 - Context->ShellcodeBase,(ulong)Operand_00->Size,
                          '\x01','\0');
    }
    if (Operand_00->Size < (uint)((byte)*(undefined8 *)((long)&Context->Arch + 0xc) & 0xf)) {
      local_cc = (uint)((byte)*(undefined8 *)((long)&Context->Arch + 0xc) & 0xf);
    }
    else {
      local_cc = Operand_00->Size;
    }
    NVar1 = ShemuIsStackPtr(Context,NVar3,(ulong)local_cc);
    if (NVar1 != '\0') {
      if ((*(int *)((long)&Context->Arch + 0x1a8) == 0x4a) ||
         (*(int *)((long)&Context->Arch + 0x1a8) == 0x49)) {
        ShemuBmpStateUpdate(Context->Intbuf,Context->StackSize,NVar3 - Context->StackBase,
                            (ulong)((byte)*(undefined8 *)((long)&Context->Arch + 0xc) & 0xf),'\x01',
                            '\0');
      }
      else if (*(int *)((long)&Context->Arch + 0x1a8) == 0xed) {
        if (((byte)*(undefined8 *)((long)&Context->Arch + 0xc) & 0xf) < 5) {
          local_ec = (uint)((byte)*(undefined8 *)((long)&Context->Arch + 0xc) & 0xf);
        }
        else {
          local_ec = 4;
        }
        ShemuBmpStateUpdate(Context->Intbuf,Context->StackSize,(NVar3 + 0xc) - Context->StackBase,
                            (long)(int)local_ec,'\x01','\0');
      }
      else if ((*(int *)((long)&Context->Arch + 0x1a8) == 0x10d) ||
              (*(int *)((long)&Context->Arch + 0x1a8) == 0x10e)) {
        ShemuBmpStateUpdate(Context->Intbuf,Context->StackSize,(NVar3 + 8) - Context->StackBase,
                            (ulong)((byte)*(undefined8 *)((long)&Context->Arch + 0xc) & 0xf),'\x01',
                            '\0');
      }
      else {
        ShemuBmpStateUpdate(Context->Intbuf,Context->StackSize,NVar3 - Context->StackBase,
                            (ulong)Operand_00->Size,'\x01','\x01');
      }
    }
    if (Value->Size < Operand_00->Size) {
      local_104 = Value->Size;
    }
    else {
      local_104 = Operand_00->Size;
    }
    Context_local._0_4_ = ShemuMemStore(Context,NVar3,(ulong)local_104,(ND_UINT8 *)Value);
    if ((SHEMU_STATUS)Context_local != 0) goto LAB_00172267;
    if ((Context->Options & 8) != 0) {
      ShemuDisplayMemValue(Context,NVar3,(ulong)Value->Size,(ND_UINT8 *)Value,'\0');
    }
    if ((*(ushort *)&Operand_00->Info >> 7 & 1) != 0) {
      NVar3 = ShemuX86GetGprValue(Context,4,2 << ((byte)(*(uint *)&Context->Arch >> 4) & 3),'\0');
      ShemuX86SetGprValue(Context,4,2 << ((byte)(*(uint *)&Context->Arch >> 4) & 3),
                          NVar3 - Operand_00->Size,'\0');
    }
    if ((*(ushort *)&Operand_00->Info >> 8 & 1) != 0) {
      local_110 = ShemuX86GetGprValue(Context,(uint)(*(byte *)((long)&Operand_00->Info + 10) >> 3),
                                      (uint)(Operand_00->Info).Memory.BaseSize,'\0');
      if (((Context->Arch).X86.Registers.RegFlags & 0x400) == 0) {
        uVar4 = (ulong)Operand_00->Size;
      }
      else {
        uVar4 = -(ulong)Operand_00->Size;
      }
      local_110 = local_110 + uVar4;
      ShemuX86SetGprValue(Context,(uint)(*(byte *)((long)&Operand_00->Info + 10) >> 3),
                          (uint)(Operand_00->Info).Memory.BaseSize,local_110,'\0');
    }
  }
  Context_local._0_4_ = 0;
LAB_00172267:
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_10) {
    return (SHEMU_STATUS)Context_local;
  }
  __stack_chk_fail();
}

Assistant:

static SHEMU_STATUS
ShemuX86SetOperandValue(
    SHEMU_CONTEXT *Context,
    ND_UINT32 Operand,
    SHEMU_VALUE *Value
    )
{
    SHEMU_STATUS status;
    PND_OPERAND op = &Context->Arch.X86.Instruction.Operands[Operand];

    // If a stack address is being loaded, check if it points to a string built on the stack.
    if (ShemuIsStackPtr(Context, Value->Value.Qwords[0], Context->StrThreshold))
    {
        ND_UINT64 sptr = Value->Value.Qwords[0];
        ND_UINT32 i, stckstrlen = 0;

        // Check if a string was saved on the stack. Typically used by shellcodes like this:
        // PUSH str0
        // PUSH str1
        // ...
        // PUSH strn
        // Other variants may exist, but all we care about are stores on the stack, and all are checked.

        for (i = 0; i < Context->StrThreshold; i++)
        {
            unsigned char c;

            status = ShemuMemLoad(Context, sptr + i, 1, &c);
            if (SHEMU_SUCCESS != status)
            {
                break;
            }

            if ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') ||
                c == '\\' || c == '/' || c == ':' || c == ' ')
            {
                stckstrlen++;
            }
            else
            {
                break;
            }
        }

        if (stckstrlen >= Context->StrThreshold)
        {
            Context->Flags |= SHEMU_FLAG_STACK_STR;
        }
    }


    if (op->Type == ND_OP_REG)
    {
        switch (op->Info.Register.Type)
        {
        case ND_REG_GPR:
            if (Context->Arch.X86.Instruction.Instruction == ND_INS_XCHG &&
                op->Info.Register.Reg == NDR_RSP &&
                ShemuX86IsAddressAligned(Context, Value->Value.Qwords[0]))
            {
                // Conditions for a STACK_PIVOT detection:
                // 1. The instruction is XCHG
                // 2. The value loaded in the RSP register is naturally aligned
                // 3. The value points either inside the shellcode or the stack area, and at least 64 bytes are valid
                if (ShemuIsShellcodePtr(Context, Value->Value.Qwords[0], 64) ||
                    ShemuIsStackPtr(Context, Value->Value.Qwords[0], 64))
                {
                    Context->Flags |= SHEMU_FLAG_STACK_PIVOT;
                }
            }

            ShemuX86SetGprValue(Context, op->Info.Register.Reg, op->Size, Value->Value.Qwords[0], 
                             op->Info.Register.IsHigh8);
            break;

        case ND_REG_SEG:
            if (!ShemuX86IsSelectorValid(Context, op->Info.Register.Reg, Value->Value.Words[0]))
            {
                return SHEMU_ABORT_INVALID_SELECTOR;
            }
            ShemuX86SetSegValue(Context, op->Info.Register.Reg, Value->Value.Words[0]);
            break;

        case ND_REG_MMX:
            Context->Arch.X86.MmxRegisters[op->Info.Register.Reg] = Value->Value.Qwords[0];
            // Only log these when they're written.
            if (Context->Options & SHEMU_OPT_TRACE_EMULATION)
            {
                shemu_printf(Context, "        MM%d = 0x%016llx\n", op->Info.Register.Reg, Value->Value.Qwords[0]);
            }
            break;

        case ND_REG_SSE:
            if (Context->Arch.X86.Instruction.EncMode != ND_ENCM_LEGACY)
            {
                // Zero the entire register first, if we have a VEX/EVEX encoded instruction.
                nd_memzero(&Context->Arch.X86.SseRegisters[op->Info.Register.Reg], ND_MAX_REGISTER_SIZE);
            }
            else
            {
                // Zero upper bits in the 128 bits register, if operand size is less than 16 bytes.
                // Upper bits in the YMM/ZMM register are preserved.
                nd_memzero(&Context->Arch.X86.SseRegisters[op->Info.Register.Reg], 16);
            }
            // Copy the value.
            shemu_memcpy(&Context->Arch.X86.SseRegisters[op->Info.Register.Reg],
                         Value->Value.Bytes, 
                         op->Size);
            // Only log these when they're written.
            if (Context->Options & SHEMU_OPT_TRACE_EMULATION)
            {
                shemu_printf(Context,
                             "        %cMM%d (HI_32) = 0x%016llx%016llx%016llx%016llx\n",
                             op->Size == 16 ? 'X' : op->Size == 32 ? 'Y' : 'Z', op->Info.Register.Reg,
                             Value->Value.Qwords[7], Value->Value.Qwords[6], 
                             Value->Value.Qwords[5], Value->Value.Qwords[4]);
                shemu_printf(Context,
                             "        %cMM%d (LO_32) = 0x%016llx%016llx%016llx%016llx\n",
                             op->Size == 16 ? 'X' : op->Size == 32 ? 'Y' : 'Z', op->Info.Register.Reg,
                             Value->Value.Qwords[3], Value->Value.Qwords[2], 
                             Value->Value.Qwords[1], Value->Value.Qwords[0]);
            }
            break;

        case ND_REG_RIP:
            Context->Arch.X86.Registers.RegRip = ND_TRIM(Value->Size, Value->Value.Qwords[0]);
            break;

        case ND_REG_FLG:
            if (op->Size == 2)
            {
                *((ND_UINT16*)&Context->Arch.X86.Registers.RegFlags) = Value->Value.Words[0];
            }
            else
            {
                Context->Arch.X86.Registers.RegFlags = Value->Value.Qwords[0];
            }
            // Handle reserved bits.
            Context->Arch.X86.Registers.RegFlags |= (1ULL << 1);
            Context->Arch.X86.Registers.RegFlags &= ~((1ULL << 3) | (1ULL << 5) | (1ULL << 15));
            Context->Arch.X86.Registers.RegFlags &= 0x3FFFFF;
            break;

        case ND_REG_CR:
            switch (op->Info.Register.Reg)
            {
            case NDR_CR0:
                Context->Arch.X86.Registers.RegCr0 = Value->Value.Qwords[0];
                break;
            case NDR_CR2:
                Context->Arch.X86.Registers.RegCr2 = Value->Value.Qwords[0];
                break;
            case NDR_CR3:
                Context->Arch.X86.Registers.RegCr3 = Value->Value.Qwords[0];
                break;
            case NDR_CR4:
                Context->Arch.X86.Registers.RegCr4 = Value->Value.Qwords[0];
                break;
            case NDR_CR8:
                Context->Arch.X86.Registers.RegCr8 = Value->Value.Qwords[0];
                break;
            default:
                return SHEMU_ABORT_REGISTER_NOT_SUPPORTED;
            }
            break;

        default:
            return SHEMU_ABORT_REGISTER_NOT_SUPPORTED;
        }
    }
    else if (op->Type == ND_OP_MEM)
    {
        // Compute the GLA.
        ND_UINT64 gla = ShemuX86ComputeLinearAddress(Context, op);

        // Handle self-write. We store a 1 for each written byte inside the shellcode space. Once the modified bytes
        // are executed, we can trigger the self-write detection.
        if (ShemuIsShellcodePtr(Context, gla, op->Size))
        {
            ShemuShellBmpStateSet(Context, gla - Context->ShellcodeBase, op->Size, SHELL_BYTE_DIRTY);
        }

        // Handle RIP save on the stack.
        if (ShemuIsStackPtr(Context, gla, MAX(op->Size, Context->Arch.X86.Instruction.WordLength)))
        {
            // Note: only Context->Arch.X86.Instruction.WordLength bits are flagged as RIP, as that is the RIP size.
            if (Context->Arch.X86.Instruction.Instruction == ND_INS_CALLNR ||
                Context->Arch.X86.Instruction.Instruction == ND_INS_CALLNI)
            {
                ShemuStackBmpStateSet(Context, gla - Context->StackBase, 
                                      Context->Arch.X86.Instruction.WordLength, STACK_BYTE_RIP);
            }
            else if (Context->Arch.X86.Instruction.Instruction == ND_INS_FNSTENV)
            {
                // OK: op->Size will be the FPU state size (28 bytes); we only emulate 32 & 64 bit forms, the RIP is 
                // always 4 bytes.
                ShemuStackBmpStateSet(Context, (gla + 0xC) - Context->StackBase, 
                                      MIN(Context->Arch.X86.Instruction.WordLength, 4), STACK_BYTE_RIP);
            }
            else if (Context->Arch.X86.Instruction.Instruction == ND_INS_FXSAVE || 
                Context->Arch.X86.Instruction.Instruction == ND_INS_FXSAVE64)
            {
                // OK: op->Size will be the FXSAVE size (512 bytes).
                ShemuStackBmpStateSet(Context, (gla + 0x8) - Context->StackBase, 
                                      Context->Arch.X86.Instruction.WordLength, STACK_BYTE_RIP);
            }
            else
            {
                // Something is written on a previously saved RIP; reset it.
                ShemuStackBmpStateClear(Context, gla - Context->StackBase, op->Size, STACK_BYTE_RIP);
            }
        }

        // Set the value.
        status = ShemuMemStore(Context, gla, MIN(op->Size, Value->Size), Value->Value.Bytes);
        if (SHEMU_SUCCESS != status)
        {
            return status;
        }

        if (Context->Options & SHEMU_OPT_TRACE_MEMORY)
        {
            ShemuDisplayMemValue(Context, gla, Value->Size, Value->Value.Bytes, ND_FALSE);
        }

        // If this is a stack access, we need to update the stack pointer.
        if (op->Info.Memory.IsStack)
        {
            ND_UINT64 regval = ShemuX86GetGprValue(Context, NDR_RSP, (2 << Context->Arch.X86.Instruction.DefStack), ND_FALSE);

            regval -= op->Size;

            ShemuX86SetGprValue(Context, NDR_RSP, (2 << Context->Arch.X86.Instruction.DefStack), regval, ND_FALSE);
        }

        // If this is a string operation, make sure we update RSI/RDI.
        if (op->Info.Memory.IsString)
        {
            ND_UINT64 regval = ShemuX86GetGprValue(Context, op->Info.Memory.Base, op->Info.Memory.BaseSize, ND_FALSE);

            regval = GET_FLAG(Context, NDR_RFLAG_DF) ? regval - op->Size : regval + op->Size;

            ShemuX86SetGprValue(Context, op->Info.Memory.Base, op->Info.Memory.BaseSize, regval, ND_FALSE);
        }
    }
    else
    {
        return SHEMU_ABORT_OPERAND_NOT_SUPPORTED;
    }

    return SHEMU_SUCCESS;
}